

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLtesting.c
# Opt level: O3

void RDL_calculate_transitive_closure(char **graph,uint n)

{
  uint uVar1;
  int iVar2;
  void *__s;
  RDL_stack *stack;
  undefined4 *puVar3;
  uint *__ptr;
  ulong uVar4;
  ulong __size;
  ulong uVar5;
  
  __size = (ulong)n;
  __s = malloc(__size);
  if (n != 0) {
    uVar4 = 0;
    do {
      stack = RDL_stack_new();
      memset(__s,0,__size);
      puVar3 = (undefined4 *)malloc(4);
      *puVar3 = (int)uVar4;
      RDL_stack_push(stack,puVar3);
      iVar2 = RDL_stack_empty(stack);
      while (iVar2 == 0) {
        __ptr = (uint *)RDL_stack_top(stack);
        uVar1 = *__ptr;
        RDL_stack_pop(stack);
        free(__ptr);
        *(undefined1 *)((long)__s + (ulong)uVar1) = 1;
        uVar5 = 0;
        do {
          if (graph[uVar1][uVar5] != '\0') {
            graph[uVar4][uVar5] = '\x01';
            graph[uVar5][uVar4] = '\x01';
            if (*(char *)((long)__s + uVar5) == '\0') {
              puVar3 = (undefined4 *)malloc(4);
              *puVar3 = (int)uVar5;
              RDL_stack_push(stack,puVar3);
            }
          }
          uVar5 = uVar5 + 1;
        } while (__size != uVar5);
        iVar2 = RDL_stack_empty(stack);
      }
      RDL_stack_delete(stack);
      uVar4 = uVar4 + 1;
    } while (uVar4 != __size);
  }
  free(__s);
  return;
}

Assistant:

void RDL_calculate_transitive_closure(char** graph, unsigned n)
{
  RDL_stack* dfs_stack;
  char* visited = (char*)malloc(n * sizeof(*visited));
  unsigned i, j, current;
  unsigned *val, *current_element, *new_element;

  for (i = 0; i < n; ++i) {
    dfs_stack = RDL_stack_new();
    memset(visited, 0, n * sizeof(*visited));

    val = malloc(sizeof(*val));
    *val = i;

    RDL_stack_push(dfs_stack, val);

    while (!RDL_stack_empty(dfs_stack)) {
      current_element = RDL_stack_top(dfs_stack);
      current = *current_element;
      RDL_stack_pop(dfs_stack);
      free(current_element);

      visited[current] = 1;
      for (j = 0; j < n; ++j) {
        if (graph[current][j]) {
          graph[i][j] = 1;
          graph[j][i] = 1;
          if (!visited[j]) {
            new_element = malloc(sizeof(*new_element));
            *new_element = j;
            RDL_stack_push(dfs_stack, new_element);
          }
        }
      }
    }

    RDL_stack_delete(dfs_stack);
  }

  free(visited);
}